

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O0

QString * __thiscall
ProjectBuilderMakefileGenerator::keyFor(ProjectBuilderMakefileGenerator *this,QString *block)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  QString *pQVar4;
  char *in_RDX;
  QMakeProject *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *ret;
  QString *config;
  QHash<QString,_QString> *this_00;
  undefined7 in_stack_ffffffffffffff48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QHash<QString,_QString> *)(in_RSI->super_QMakeEvaluator).m_superfile.d.size;
  config = in_RDI;
  QString::QString((QString *)in_RSI,in_RDX);
  bVar2 = QMakeProject::isActiveConfig(in_RSI,config,SUB81((ulong)in_RDI >> 0x38,0));
  QString::~QString((QString *)0x134466);
  if ((bVar2 & 1) == 0) {
    (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    (in_RDI->d).size = -0x5555555555555556;
    QString::QString((QString *)0x1344b1);
    bVar3 = QHash<QString,_QString>::contains((QHash<QString,_QString> *)in_RSI,config);
    if (bVar3) {
      pQVar4 = QHash<QString,_QString>::operator[](this_00,(QString *)in_RSI);
      QString::operator=(in_RDI,(QString *)pQVar4);
    }
    else {
      QString::toUtf8(in_RDI);
      qtSha1((QByteArray *)CONCAT17(bVar2,in_stack_ffffffffffffff48));
      QString::left((QString *)CONCAT17(bVar2,in_stack_ffffffffffffff48),(qsizetype)this_00);
      QString::toUpper(in_RDI);
      QString::operator=(config,in_RDI);
      QString::~QString((QString *)0x134537);
      QString::~QString((QString *)0x134544);
      QString::~QString((QString *)0x13454e);
      QByteArray::~QByteArray((QByteArray *)0x134558);
      QHash<QString,_QString>::insert((QHash<QString,_QString> *)config,in_RDI,(QString *)0x134572);
    }
  }
  else {
    QString::QString(config,in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return config;
  }
  __stack_chk_fail();
}

Assistant:

QString
ProjectBuilderMakefileGenerator::keyFor(const QString &block)
{
#if 1 //This make this code much easier to debug..
    if(project->isActiveConfig("no_pb_munge_key"))
       return block;
#endif
    QString ret;
    if(!keys.contains(block)) {
        ret = qtSha1(block.toUtf8()).left(24).toUpper();
        keys.insert(block, ret);
    } else {
        ret = keys[block];
    }
    return ret;
}